

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O3

bool __thiscall
iDynTree::KinDynComputations::getFrameFreeFloatingJacobianSparsityPattern
          (KinDynComputations *this,FrameIndex frameIndex,MatrixView<double> *outJacobianPattern)

{
  undefined8 *puVar1;
  MatrixStorageOrdering MVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  char cVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  pointer peVar10;
  long *plVar11;
  size_t c;
  ulong uVar12;
  double *pdVar13;
  char *pcVar14;
  double *pdVar15;
  index_type iVar16;
  char *pcVar17;
  element_type *peVar18;
  pointer peVar19;
  ulong uVar20;
  Index i;
  long lVar21;
  long lVar22;
  PointerType ptr;
  pointer peVar23;
  long lVar24;
  long lVar25;
  ulong uVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  ulong uVar30;
  int iVar31;
  SpatialMotionVector jointMotionSubspace;
  type tmp;
  Matrix6x6 genericAdjointTransform;
  long local_200;
  double local_1b8;
  double dStack_1b0;
  double local_1a8;
  double local_1a0 [3];
  element_type aeStack_188 [7];
  double local_150 [5];
  element_type aeStack_128 [31];
  
  cVar6 = iDynTree::Model::isValidFrameIndex((long)&this->pimpl->m_robot_model);
  if (cVar6 == '\0') {
    pcVar17 = "getFrameJacobian";
    pcVar14 = "Frame index out of bounds";
  }
  else {
    if ((outJacobianPattern->m_rows == 6) &&
       (lVar25 = outJacobianPattern->m_cols, lVar9 = iDynTree::Model::getNrOfDOFs(),
       lVar25 == lVar9 + 6)) {
      local_200 = iDynTree::Model::getFrameLink((long)&this->pimpl->m_robot_model);
      lVar25 = 0;
      memset(local_150,0,0x120);
      auVar5 = _DAT_00116010;
      auVar4 = _DAT_00116000;
      do {
        *(undefined8 *)((long)local_150 + lVar25) = 0x3ff0000000000000;
        *(undefined8 *)((long)local_150 + lVar25 + 8) = 0x3ff0000000000000;
        *(undefined8 *)((long)local_150 + lVar25 + 0x10) = 0x3ff0000000000000;
        lVar25 = lVar25 + 0x30;
      } while (lVar25 != 0x90);
      uVar26 = (ulong)((uint)((ulong)(local_150 + 3) >> 3) & 1);
      lVar25 = uVar26 * 8;
      lVar9 = 0;
      do {
        if (uVar26 == 0) {
          puVar1 = (undefined8 *)((long)local_150 + lVar9 + lVar25 + 0x18);
          *puVar1 = 0x3ff0000000000000;
          puVar1[1] = 0x3ff0000000000000;
          *(undefined8 *)((long)aeStack_128 + lVar9 + lVar25) = 0x3ff0000000000000;
        }
        else {
          *(undefined8 *)((long)local_150 + lVar9 + 0x18) = 0x3ff0000000000000;
          puVar1 = (undefined8 *)((long)local_150 + lVar9 + lVar25 + 0x18);
          *puVar1 = 0x3ff0000000000000;
          puVar1[1] = 0x3ff0000000000000;
        }
        lVar9 = lVar9 + 0x30;
      } while (lVar9 != 0x90);
      lVar25 = 0xa8;
      do {
        *(undefined8 *)((long)local_150 + lVar25) = 0x3ff0000000000000;
        *(undefined8 *)((long)local_150 + lVar25 + 8) = 0x3ff0000000000000;
        *(undefined8 *)((long)local_150 + lVar25 + 0x10) = 0x3ff0000000000000;
        lVar25 = lVar25 + 0x30;
      } while (lVar25 != 0x138);
      MVar2 = outJacobianPattern->m_storageOrder;
      lVar25 = outJacobianPattern->m_cols;
      lVar9 = outJacobianPattern->m_rows;
      lVar24 = 1;
      if (MVar2 == ColumnMajor) {
        lVar24 = lVar9;
      }
      lVar21 = 1;
      if (MVar2 != ColumnMajor) {
        lVar21 = lVar25;
      }
      if (0 < lVar9) {
        peVar10 = outJacobianPattern->m_storage;
        lVar22 = lVar25 + -1;
        auVar27._8_4_ = (int)lVar22;
        auVar27._0_8_ = lVar22;
        auVar27._12_4_ = (int)((ulong)lVar22 >> 0x20);
        lVar22 = 0;
        auVar27 = auVar27 ^ _DAT_00116010;
        peVar19 = peVar10;
        do {
          peVar23 = peVar19;
          uVar26 = lVar25 + 1U & 0xfffffffffffffffe;
          auVar28 = auVar4;
          if (0 < lVar25) {
            do {
              bVar3 = auVar27._0_4_ < SUB164(auVar28 ^ auVar5,0);
              iVar7 = auVar27._4_4_;
              iVar31 = SUB164(auVar28 ^ auVar5,4);
              if ((bool)(~(iVar7 < iVar31 || iVar31 == iVar7 && bVar3) & 1)) {
                *peVar23 = 0.0;
              }
              if (iVar7 >= iVar31 && (iVar31 != iVar7 || !bVar3)) {
                peVar23[lVar24] = 0.0;
              }
              auVar29._0_8_ = auVar28._0_8_ + 2;
              auVar29._8_8_ = auVar28._8_8_ + 2;
              uVar26 = uVar26 - 2;
              peVar23 = peVar23 + lVar24 * 2;
              auVar28 = auVar29;
            } while (uVar26 != 0);
          }
          lVar22 = lVar22 + 1;
          peVar19 = peVar19 + lVar21;
        } while (lVar22 != lVar9);
        lVar25 = outJacobianPattern->m_rows;
        iVar16 = 1;
        if (MVar2 != ColumnMajor) {
          iVar16 = outJacobianPattern->m_cols;
        }
        if (0 < lVar25) {
          lVar9 = 1;
          if (MVar2 == ColumnMajor) {
            lVar9 = lVar25;
          }
          peVar18 = aeStack_128;
          do {
            *peVar10 = peVar18[-5];
            peVar10[lVar9] = peVar18[-4];
            peVar10[lVar9 * 2] = peVar18[-3];
            peVar10[lVar9 * 3] = peVar18[-2];
            peVar10[lVar9 * 4] = peVar18[-1];
            peVar10[lVar9 * 5] = *peVar18;
            peVar18 = peVar18 + 6;
            peVar10 = peVar10 + iVar16;
            lVar25 = lVar25 + -1;
          } while (lVar25 != 0);
        }
      }
      iDynTree::Traversal::getBaseLink();
      lVar25 = iDynTree::Link::getIndex();
      if (local_200 != lVar25) {
        do {
          iDynTree::Traversal::getParentLinkFromLinkIndex((long)&this->pimpl->m_traversal);
          lVar25 = iDynTree::Link::getIndex();
          plVar11 = (long *)iDynTree::Traversal::getParentJointFromLinkIndex
                                      ((long)&this->pimpl->m_traversal);
          lVar9 = (**(code **)(*plVar11 + 0xc0))(plVar11);
          iVar7 = (**(code **)(*plVar11 + 0x20))(plVar11);
          if (iVar7 != 0) {
            lVar24 = lVar9 * 8 + 0x30;
            uVar26 = 0;
            do {
              pdVar15 = &local_1b8;
              (**(code **)(*plVar11 + 0x60))(pdVar15,plVar11,uVar26 & 0xffffffff,local_200,lVar25);
              uVar12 = 0;
              uVar30 = (ulong)DAT_00116040;
              do {
                pdVar13 = local_1a0 + ((int)uVar12 - 3);
                if (uVar12 < 3) {
                  pdVar13 = pdVar15;
                }
                *pdVar13 = (double)(~-(ulong)((double)((ulong)*pdVar13 & uVar30) < DEFAULT_TOL) &
                                   0x3ff0000000000000);
                uVar12 = uVar12 + 1;
                pdVar15 = pdVar15 + 1;
              } while (uVar12 != 6);
              MVar2 = outJacobianPattern->m_storageOrder;
              iVar16 = outJacobianPattern->m_cols;
              peVar10 = outJacobianPattern->m_storage;
              uVar12 = outJacobianPattern->m_rows;
              uVar20 = 1;
              if (MVar2 == ColumnMajor) {
                uVar20 = uVar12;
              }
              pdVar15 = local_150 + 4;
              lVar21 = 0;
              do {
                local_1a0[lVar21 + 3] =
                     pdVar15[1] * local_1a0[2] + pdVar15[-1] * local_1a0[0] +
                     pdVar15[-3] * dStack_1b0 +
                     *pdVar15 * local_1a0[1] + pdVar15[-2] * local_1a8 + pdVar15[-4] * local_1b8;
                lVar21 = lVar21 + 1;
                pdVar15 = pdVar15 + 6;
              } while (lVar21 != 6);
              if (MVar2 == ColumnMajor) {
                iVar16 = 1;
              }
              if (0 < (long)uVar12) {
                peVar19 = (pointer)(uVar20 * lVar24 + (long)peVar10);
                uVar20 = 0;
                do {
                  *peVar19 = local_1a0[uVar20 + 3];
                  uVar20 = uVar20 + 1;
                  peVar19 = peVar19 + iVar16;
                } while (uVar12 != uVar20);
                uVar12 = outJacobianPattern->m_rows;
              }
              if (uVar12 != 0) {
                uVar20 = 0;
                do {
                  iVar16 = 1;
                  if (MVar2 != ColumnMajor) {
                    iVar16 = outJacobianPattern->m_cols;
                    uVar12 = 1;
                  }
                  lVar21 = uVar12 * (lVar9 + 6 + uVar26);
                  peVar10[lVar21 + iVar16 * uVar20] =
                       (element_type)
                       (~-(ulong)((double)((ulong)peVar10[lVar21 + iVar16 * uVar20] & uVar30) <
                                 DEFAULT_TOL) & 0x3ff0000000000000);
                  uVar20 = uVar20 + 1;
                  uVar12 = outJacobianPattern->m_rows;
                } while (uVar20 < uVar12);
              }
              uVar26 = uVar26 + 1;
              uVar8 = (**(code **)(*plVar11 + 0x20))(plVar11);
              lVar24 = lVar24 + 8;
            } while (uVar26 < uVar8);
          }
          iDynTree::Traversal::getBaseLink();
          lVar9 = iDynTree::Link::getIndex();
          local_200 = lVar25;
        } while (lVar25 != lVar9);
      }
      return true;
    }
    pcVar17 = "getFrameFreeJacobianSparsityPattern";
    pcVar14 = "Wrong size in input outJacobianPattern";
  }
  iDynTree::reportError("KinDynComputations",pcVar17,pcVar14);
  return false;
}

Assistant:

bool KinDynComputations::getFrameFreeFloatingJacobianSparsityPattern(const FrameIndex frameIndex,
                                                                         MatrixView<double> outJacobianPattern) const
    {
        if (!pimpl->m_robot_model.isValidFrameIndex(frameIndex))
        {
            reportError("KinDynComputations","getFrameJacobian","Frame index out of bounds");
            return false;
        }

        bool ok = (outJacobianPattern.rows() == 6)
            && (outJacobianPattern.cols() == pimpl->m_robot_model.getNrOfDOFs() + 6);

        if( !ok )
        {
            reportError("KinDynComputations",
                        "getFrameFreeJacobianSparsityPattern",
                        "Wrong size in input outJacobianPattern");
            return false;
        }

        // Get the link to which the frame is attached
        LinkIndex jacobLink = pimpl->m_robot_model.getFrameLink(frameIndex);

        Matrix6x6 genericAdjointTransform;
        genericAdjointTransform.zero();
        // Set 1 to rotation matrix (top left)
        iDynTree::toEigen(genericAdjointTransform).topLeftCorner(3, 3).setOnes();
        // Set 1 to p \times R (top right)
        iDynTree::toEigen(genericAdjointTransform).topRightCorner(3, 3).setOnes();
        // Set 1 to rotation matrix (top left)
        iDynTree::toEigen(genericAdjointTransform).bottomRightCorner(3, 3).setOnes();

        // We zero the jacobian
        toEigen(outJacobianPattern).setZero();

        // Compute base part
        toEigen(outJacobianPattern).leftCols<6>() = toEigen(genericAdjointTransform);

        // Compute joint part
        // We iterate from the link up in the traveral until we reach the base
        LinkIndex visitedLinkIdx = jacobLink;

        while (visitedLinkIdx != pimpl->m_traversal.getBaseLink()->getIndex())
        {
            LinkIndex parentLinkIdx = pimpl->m_traversal.getParentLinkFromLinkIndex(visitedLinkIdx)->getIndex();
            IJointConstPtr joint = pimpl->m_traversal.getParentJointFromLinkIndex(visitedLinkIdx);

            size_t dofOffset = joint->getDOFsOffset();
            for (unsigned i = 0; i < joint->getNrOfDOFs(); ++i)
            {
                SpatialMotionVector jointMotionSubspace = joint->getMotionSubspaceVector(i, visitedLinkIdx, parentLinkIdx);
                // 1 or 0 in vector
                for (size_t c = 0; c < jointMotionSubspace.size(); ++c) {
                    jointMotionSubspace(c) = std::abs(jointMotionSubspace(c)) < iDynTree::DEFAULT_TOL ? 0.0 : 1.0;
                }
                toEigen(outJacobianPattern).col(6 + dofOffset + i) = toEigen(genericAdjointTransform) * toEigen(jointMotionSubspace);
                //have only 0 and 1 => divide component wise the column by itself
                for (size_t r = 0; r < toEigen(outJacobianPattern).col(6 + dofOffset + i).size(); ++r) {
                    toEigen(outJacobianPattern).col(6 + dofOffset + i).coeffRef(r) = std::abs(toEigen(outJacobianPattern).col(6 + dofOffset + i).coeffRef(r)) < iDynTree::DEFAULT_TOL ? 0.0 : 1.0;
                }
            }

            visitedLinkIdx = parentLinkIdx;
        }

        return true;
    }